

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_c.h
# Opt level: O3

int MPIABI_File_iwrite_all
              (MPIABI_File fh,void *buf,int count,MPIABI_Datatype datatype,MPIABI_Request *request)

{
  int iVar1;
  
  iVar1 = MPI_File_iwrite_all();
  return iVar1;
}

Assistant:

int MPIABI_File_iwrite_all(
  MPIABI_File fh,
  const void * buf,
  int count,
  MPIABI_Datatype datatype,
  MPIABI_Request * request
) {
  return MPI_File_iwrite_all(
    (MPI_File)(WPI_File)fh,
    buf,
    count,
    (MPI_Datatype)(WPI_Datatype)datatype,
    (MPI_Request *)(WPI_RequestPtr)request
  );
}